

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void cvSensFreeVectors(CVodeMem cv_mem)

{
  int iVar1;
  long in_RDI;
  int maxord;
  int j;
  undefined4 local_c;
  
  iVar1 = *(int *)(in_RDI + 0x838);
  N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f8),*(undefined4 *)(in_RDI + 0x90));
  N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x2f0),*(undefined4 *)(in_RDI + 0x90));
  N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x300),*(undefined4 *)(in_RDI + 0x90));
  N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x308),*(undefined4 *)(in_RDI + 0x90));
  N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x310),*(undefined4 *)(in_RDI + 0x90));
  for (local_c = 0; local_c <= iVar1; local_c = local_c + 1) {
    N_VDestroyVectorArray
              (*(undefined8 *)(in_RDI + 0x288 + (long)local_c * 8),*(undefined4 *)(in_RDI + 0x90));
  }
  free(*(void **)(in_RDI + 0xc0));
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  free(*(void **)(in_RDI + 200));
  *(undefined8 *)(in_RDI + 200) = 0;
  *(long *)(in_RDI + 0x718) =
       *(long *)(in_RDI + 0x718) -
       ((long)((iVar1 + 6) * *(int *)(in_RDI + 0x90)) * *(long *)(in_RDI + 0x6f8) +
       (long)*(int *)(in_RDI + 0x90));
  *(long *)(in_RDI + 0x720) =
       *(long *)(in_RDI + 0x720) -
       ((long)((iVar1 + 6) * *(int *)(in_RDI + 0x90)) * *(long *)(in_RDI + 0x700) +
       (long)*(int *)(in_RDI + 0x90));
  if (*(int *)(in_RDI + 0x858) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0xf8),*(undefined4 *)(in_RDI + 0x90));
    *(long *)(in_RDI + 0x718) =
         *(long *)(in_RDI + 0x718) - (long)*(int *)(in_RDI + 0x90) * *(long *)(in_RDI + 0x6f8);
    *(long *)(in_RDI + 0x720) =
         *(long *)(in_RDI + 0x720) - (long)*(int *)(in_RDI + 0x90) * *(long *)(in_RDI + 0x700);
  }
  if (*(int *)(in_RDI + 0x85c) != 0) {
    free(*(void **)(in_RDI + 0xf0));
    *(undefined8 *)(in_RDI + 0xf0) = 0;
    *(long *)(in_RDI + 0x718) = *(long *)(in_RDI + 0x718) - (long)*(int *)(in_RDI + 0x90);
  }
  *(undefined4 *)(in_RDI + 0x858) = 0;
  *(undefined4 *)(in_RDI + 0x85c) = 0;
  return;
}

Assistant:

static void cvSensFreeVectors(CVodeMem cv_mem)
{
  int j, maxord;

  maxord = cv_mem->cv_qmax_allocS;

  N_VDestroyVectorArray(cv_mem->cv_yS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_ewtS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_acorS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_tempvS, cv_mem->cv_Ns);
  N_VDestroyVectorArray(cv_mem->cv_ftempS, cv_mem->cv_Ns);

  for (j = 0; j <= maxord; j++)
  {
    N_VDestroyVectorArray(cv_mem->cv_znS[j], cv_mem->cv_Ns);
  }

  free(cv_mem->cv_pbar);
  cv_mem->cv_pbar = NULL;
  free(cv_mem->cv_plist);
  cv_mem->cv_plist = NULL;

  cv_mem->cv_lrw -= (maxord + 6) * cv_mem->cv_Ns * cv_mem->cv_lrw1 +
                    cv_mem->cv_Ns;
  cv_mem->cv_liw -= (maxord + 6) * cv_mem->cv_Ns * cv_mem->cv_liw1 +
                    cv_mem->cv_Ns;

  if (cv_mem->cv_VabstolSMallocDone)
  {
    N_VDestroyVectorArray(cv_mem->cv_VabstolS, cv_mem->cv_Ns);
    cv_mem->cv_lrw -= cv_mem->cv_Ns * cv_mem->cv_lrw1;
    cv_mem->cv_liw -= cv_mem->cv_Ns * cv_mem->cv_liw1;
  }
  if (cv_mem->cv_SabstolSMallocDone)
  {
    free(cv_mem->cv_SabstolS);
    cv_mem->cv_SabstolS = NULL;
    cv_mem->cv_lrw -= cv_mem->cv_Ns;
  }
  cv_mem->cv_VabstolSMallocDone = SUNFALSE;
  cv_mem->cv_SabstolSMallocDone = SUNFALSE;
}